

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

void __thiscall
cmListFileBacktrace::cmListFileBacktrace(cmListFileBacktrace *this,cmListFileBacktrace *r)

{
  bool bVar1;
  cmListFileBacktrace *r_local;
  cmListFileBacktrace *this_local;
  
  (this->Bottom).State = (r->Bottom).State;
  (this->Bottom).Position.Tree = (r->Bottom).Position.Tree;
  (this->Bottom).Position.Position = (r->Bottom).Position.Position;
  this->Cur = r->Cur;
  if (this->Cur != (Entry *)0x0) {
    bVar1 = cmStateSnapshot::IsValid(&this->Bottom);
    if (!bVar1) {
      __assert_fail("this->Bottom.IsValid()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmListFileCache.cxx"
                    ,0x15c,"cmListFileBacktrace::cmListFileBacktrace(const cmListFileBacktrace &)");
    }
    Entry::Ref(this->Cur);
  }
  return;
}

Assistant:

cmListFileBacktrace::cmListFileBacktrace(cmListFileBacktrace const& r)
  : Bottom(r.Bottom)
  , Cur(r.Cur)
{
  if (this->Cur) {
    assert(this->Bottom.IsValid());
    this->Cur->Ref();
  }
}